

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O1

string * google::protobuf::compiler::cpp::FilenameIdentifier
                   (string *__return_storage_ptr__,string *filename)

{
  byte bVar1;
  ulong uVar2;
  char buffer [32];
  char acStack_48 [32];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (filename->_M_string_length != 0) {
    uVar2 = 0;
    do {
      bVar1 = (filename->_M_dataplus)._M_p[uVar2];
      if (((byte)(bVar1 - 0x30) < 10) || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)) {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      else {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        FastHexToBuffer((uint)(byte)(filename->_M_dataplus)._M_p[uVar2],acStack_48);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < filename->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

string FilenameIdentifier(const string& filename) {
  string result;
  for (int i = 0; i < filename.size(); i++) {
    if (ascii_isalnum(filename[i])) {
      result.push_back(filename[i]);
    } else {
      // Not alphanumeric.  To avoid any possibility of name conflicts we
      // use the hex code for the character.
      result.push_back('_');
      char buffer[kFastToBufferSize];
      result.append(FastHexToBuffer(static_cast<uint8>(filename[i]), buffer));
    }
  }
  return result;
}